

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecAssignment(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  unique_ptr<enact::AssignExpr,_std::default_delete<enact::AssignExpr>_> local_70;
  undefined1 local_68 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  undefined1 local_20 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  Parser *this_local;
  
  parsePrecLogicalOr((Parser *)local_20);
  bVar1 = consume(in_RSI,EQUAL);
  if (bVar1) {
    Token::Token((Token *)&rightExpr,&in_RSI->m_previous);
    parsePrecAssignment((Parser *)local_68);
    std::
    make_unique<enact::AssignExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_70,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_20,
               (Token *)local_68);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
    unique_ptr<enact::AssignExpr,std::default_delete<enact::AssignExpr>,void>
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_70);
    std::unique_ptr<enact::AssignExpr,_std::default_delete<enact::AssignExpr>_>::~unique_ptr
              (&local_70);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_68);
    Token::~Token((Token *)&rightExpr);
  }
  else {
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_20);
  }
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_20);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecAssignment() {
        std::unique_ptr<Expr> expr = parsePrecLogicalOr();

        if (consume(TokenType::EQUAL)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecAssignment(); // Right-associative
            return std::make_unique<AssignExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }